

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O1

int Vec_StrGets(char *pBuffer,int nBufferSize,Vec_Str_t *vStr,int *pPos)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (nBufferSize < 2) {
    __assert_fail("nBufferSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                  ,0x141,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
  }
  pcVar3 = vStr->pArray;
  iVar1 = *pPos;
  pcVar6 = pcVar3 + iVar1;
  iVar2 = vStr->nSize;
  if (iVar1 == iVar2) {
    *pBuffer = '\0';
  }
  else {
    if (iVar2 <= iVar1) {
      __assert_fail("pBeg < pEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                    ,0x147,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
    }
    pcVar5 = pBuffer + 1;
    lVar4 = 0;
    do {
      pcVar5[-1] = *pcVar6;
      if (*pcVar6 == '\n') {
        *pPos = (*pPos - (int)lVar4) + 1;
LAB_00368599:
        *pcVar5 = '\0';
        return 1;
      }
      if (*pcVar6 == '\0') {
        *pPos = *pPos - (int)lVar4;
        return 0;
      }
      if (-lVar4 == (ulong)(nBufferSize - 1)) {
        *pPos = *pPos + nBufferSize;
        goto LAB_00368599;
      }
      pcVar6 = pcVar6 + 1;
      pcVar5 = pcVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (pcVar6 < pcVar3 + iVar2);
  }
  return 0;
}

Assistant:

int Vec_StrGets( char * pBuffer, int nBufferSize, Vec_Str_t * vStr, int * pPos )
{
    char * pCur;
    char * pBeg = Vec_StrArray(vStr) + *pPos;
    char * pEnd = Vec_StrArray(vStr) + Vec_StrSize(vStr);
    assert( nBufferSize > 1 );
    if ( pBeg == pEnd )
    {
        *pBuffer = 0;
        return 0;
    }
    assert( pBeg < pEnd );
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    {
        *pBuffer++ = *pCur;
        if ( *pCur == 0 )
        {
            *pPos += pCur - pBeg;
            return 0;
        }
        if ( *pCur == '\n' )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
        if ( pCur - pBeg == nBufferSize-1 )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
    }
    return 0;
}